

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageIfLoaded(Context *this,string *name)

{
  iterator iVar1;
  key_type *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<pstack::Elf::Object> sVar3;
  
  elfLookups = elfLookups + 1;
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                  *)&name[1].field_2,in_RDX);
  if (iVar1._M_node == (_Base_ptr)((long)&name[1].field_2 + 8)) {
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl = 0;
    *(undefined8 *)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
    _Var2._M_pi = extraout_RDX;
  }
  else {
    elfHits = elfHits + 1;
    std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2))
    ;
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar3.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageIfLoaded(const std::string &name)
{
    elfLookups++;
    auto it = elfCache.find(name);
    if (it != elfCache.end()) {
        elfHits++;
        return it->second;
    }
    return {};
}